

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

void __thiscall chrono::ChSolverADMM::ArchiveOUT(ChSolverADMM *this,ChArchiveOut *marchive)

{
  AdmmStepType_mapper mmapper;
  AdmmStepType_mapper local_80;
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> local_60;
  char *local_40;
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> *local_38;
  undefined1 local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChSolverADMM>(marchive);
  ChIterativeSolverVI::ArchiveOUT(&this->super_ChIterativeSolverVI,marchive);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->precond;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9c723a;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->rho;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca86c;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->rho_b;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca870;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->sigma;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca876;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->stepadjust_each;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca87c;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->stepadjust_threshold;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca88c;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->stepadjust_maxfactor;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca8a1;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->tol_prim;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca8b6;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.value_ptr =
       (AdmmStepType *)&this->tol_dual;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9ca8bf;
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  my_enum_mappers::AdmmStepType_mapper::AdmmStepType_mapper(&local_80);
  my_enum_mappers::AdmmStepType_mapper::operator()(&local_60,&local_80,&this->stepadjust_type);
  local_40 = "stepadjust_type";
  local_30 = 0;
  local_38 = &local_60;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b3a780
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b3a780;
  if (local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChSolverADMM::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverADMM>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(precond);
    marchive << CHNVP(rho);
    marchive << CHNVP(rho_b);
    marchive << CHNVP(sigma);
    marchive << CHNVP(stepadjust_each);
    marchive << CHNVP(stepadjust_threshold);
    marchive << CHNVP(stepadjust_maxfactor);
    marchive << CHNVP(tol_prim);
    marchive << CHNVP(tol_dual);
    my_enum_mappers::AdmmStepType_mapper mmapper;
    marchive << CHNVP(mmapper(this->stepadjust_type), "stepadjust_type");
}